

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parallel.h
# Opt level: O0

AsyncJob<pbrt::Sampler> *
pbrt::
RunAsync<pbrt::BasicScene::SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)::__0>
          (anon_class_152_2_c356fade_for__M_f *func)

{
  int iVar1;
  AsyncJob<pbrt::Sampler> *pAVar2;
  unique_lock<std::mutex> lock;
  AsyncJob<pbrt::Sampler> *job;
  type fvoid;
  anon_class_152_2_c356fade_for__M_f *in_stack_fffffffffffffed8;
  unique_lock<std::mutex> *in_stack_fffffffffffffee0;
  undefined4 in_stack_fffffffffffffee8;
  undefined4 in_stack_fffffffffffffeec;
  ThreadPool *in_stack_fffffffffffffef8;
  AsyncJob<pbrt::Sampler> *in_stack_ffffffffffffff00;
  unique_lock<std::mutex> local_f8;
  undefined1 local_e1;
  AsyncJob<pbrt::Sampler> *local_b0;
  
  std::
  bind<pbrt::BasicScene::SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)::__0&>
            (in_stack_fffffffffffffed8);
  pAVar2 = (AsyncJob<pbrt::Sampler> *)operator_new(0xb8);
  local_e1 = 1;
  std::function<pbrt::Sampler()>::
  function<std::_Bind<pbrt::BasicScene::SetOptions(pbrt::SceneEntity,pbrt::SceneEntity,pbrt::CameraSceneEntity,pbrt::SceneEntity,pbrt::SceneEntity,pbrt::SceneEntity)::__0()>,void>
            ((function<pbrt::Sampler_()> *)pAVar2,
             (_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mmp[P]pbrt_v4_src_pbrt_scene_cpp:768:27)_()>
              *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  AsyncJob<pbrt::Sampler>::AsyncJob
            (pAVar2,(function<pbrt::Sampler_()> *)
                    CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  local_e1 = 0;
  std::function<pbrt::Sampler_()>::~function((function<pbrt::Sampler_()> *)0x5208a9);
  local_b0 = pAVar2;
  std::unique_lock<std::mutex>::unique_lock(&local_f8);
  iVar1 = RunningThreads();
  if (iVar1 == 1) {
    AsyncJob<pbrt::Sampler>::DoWork(in_stack_ffffffffffffff00);
  }
  else {
    ThreadPool::AddToJobList(in_stack_fffffffffffffef8,&pAVar2->super_ParallelJob);
    std::unique_lock<std::mutex>::operator=
              ((unique_lock<std::mutex> *)pAVar2,
               (unique_lock<std::mutex> *)CONCAT44(iVar1,in_stack_fffffffffffffee8));
    std::unique_lock<std::mutex>::~unique_lock(in_stack_fffffffffffffee0);
  }
  pAVar2 = local_b0;
  std::unique_lock<std::mutex>::~unique_lock((unique_lock<std::mutex> *)local_b0);
  std::
  _Bind<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mmp[P]pbrt-v4/src/pbrt/scene.cpp:768:27)_()>
  ::~_Bind((_Bind<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mmp[P]pbrt_v4_src_pbrt_scene_cpp:768:27)_()>
            *)0x5209aa);
  return pAVar2;
}

Assistant:

inline auto RunAsync(F func, Args &&...args) {
    // Create _AsyncJob_ for _func_ and _args_
    auto fvoid = std::bind(func, std::forward<Args>(args)...);
    using R = typename std::invoke_result_t<F, Args...>;
    AsyncJob<R> *job = new AsyncJob<R>(std::move(fvoid));

    // Enqueue _job_ or run it immediately
    std::unique_lock<std::mutex> lock;
    if (RunningThreads() == 1)
        job->DoWork();
    else
        lock = ParallelJob::threadPool->AddToJobList(job);

    return job;
}